

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

int __thiscall
QtPrivate::QGenericArrayOps<QDBusUnixFileDescriptor>::truncate
          (QGenericArrayOps<QDBusUnixFileDescriptor> *this,char *__file,__off_t __length)

{
  QDBusUnixFileDescriptor *pQVar1;
  QDBusUnixFileDescriptor *in_stack_ffffffffffffffd8;
  QArrayDataPointer<QDBusUnixFileDescriptor> *this_00;
  
  pQVar1 = QArrayDataPointer<QDBusUnixFileDescriptor>::begin
                     ((QArrayDataPointer<QDBusUnixFileDescriptor> *)0x2229f1);
  this_00 = (QArrayDataPointer<QDBusUnixFileDescriptor> *)(pQVar1 + (long)__file);
  QArrayDataPointer<QDBusUnixFileDescriptor>::end(this_00);
  std::destroy<QDBusUnixFileDescriptor*>
            ((QDBusUnixFileDescriptor *)this_00,in_stack_ffffffffffffffd8);
  (this->super_QArrayDataPointer<QDBusUnixFileDescriptor>).size = (qsizetype)__file;
  return (int)this;
}

Assistant:

void truncate(size_t newSize)
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(!this->isShared());
        Q_ASSERT(newSize < size_t(this->size));

        std::destroy(this->begin() + newSize, this->end());
        this->size = newSize;
    }